

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O0

void wolff_main<trng::mrg5>(mrg5 *R,long runs,long split,long L)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  reference pvVar4;
  ostream *poVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  double dVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  double c;
  double q;
  int i_1;
  double E2;
  double E;
  int j;
  timer t;
  int i;
  lattice s;
  double T;
  vector<double,_std::allocator<double>_> ca;
  vector<double,_std::allocator<double>_> Ea;
  int simulations;
  double c_exact;
  double E_exact;
  undefined8 in_stack_fffffffffffffe18;
  fmtflags __fmtfl;
  timer *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  lattice *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  lattice *in_stack_fffffffffffffe40;
  double in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar10;
  mrg5 *in_stack_ffffffffffffff20;
  mrg5 *R_00;
  double local_d8;
  int local_cc;
  timer local_c8;
  int local_b4;
  double in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> local_50;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  long local_10;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  __fmtfl = (fmtflags)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  switch(in_RCX) {
  case 8:
    local_28 = 0xbff7dd8c8a385fb9;
    local_30 = 0x3ff25435ecefa237;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"invalid lattice size, try 8, 12, ..., 64\n");
    exit(1);
  case 0xc:
    local_28 = 0xbff7749354406a9a;
    local_30 = 0x3ff5a5af9d83005e;
    break;
  case 0x10:
    local_28 = 0xbff73fc0ee5cd0a4;
    local_30 = 0x3ff7fab20d2f9e30;
    break;
  case 0x14:
    local_28 = 0xbff71ffcd20d346f;
    local_30 = 0x3ff9c75146930087;
    break;
  case 0x18:
    local_28 = 0xbff70ac96bb70bf1;
    local_30 = 0x3ffb3e65ade91a40;
    break;
  case 0x1c:
    local_28 = 0xbff6fba24ea4b406;
    local_30 = 0x3ffc7ac6876cf62a;
    break;
  case 0x20:
    local_28 = 0xbff6f043dc1bb4e1;
    local_30 = 0x3ffd8c5c2c2885b2;
    break;
  case 0x24:
    local_28 = 0xbff6e76b9b198115;
    local_30 = 0x3ffe7d5bb65a0ed9;
    break;
  case 0x28:
    local_28 = 0xbff6e057e231e795;
    local_30 = 0x3fff54b64837480e;
    break;
  case 0x2c:
    local_28 = 0xbff6da8d60478360;
    local_30 = 0x40000badbc92e355;
    break;
  case 0x30:
    local_28 = 0xbff6d5b9d5cfe318;
    local_30 = 0x40006476f4acb6a2;
    break;
  case 0x34:
    local_28 = 0xbff6d1a44d066b71;
    local_30 = 0x4000b6176c21f383;
    break;
  case 0x38:
    local_28 = 0xbff6ce2413b9efa3;
    local_30 = 0x400101a0c116fa8c;
    break;
  case 0x3c:
    local_28 = 0xbff6cb1b50654d69;
    local_30 = 0x400147eb883730ff;
    break;
  case 0x40:
    local_28 = 0xbff6c8739efda07c;
    local_30 = 0x400189a6207ba8a8;
  }
  local_34 = 10;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<double>::allocator((allocator<double> *)0x108d1a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,(allocator_type *)in_stack_fffffffffffffe30);
  std::allocator<double>::~allocator((allocator<double> *)0x108d43);
  std::allocator<double>::allocator((allocator<double> *)0x108d58);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,(allocator_type *)in_stack_fffffffffffffe30);
  std::allocator<double>::~allocator((allocator<double> *)0x108d81);
  std::ios_base::setf((ios_base *)in_stack_fffffffffffffe20,__fmtfl);
  std::ios_base::setf((ios_base *)in_stack_fffffffffffffe20,__fmtfl);
  dVar6 = sqrt(2.0);
  dVar6 = log1p(dVar6);
  dVar6 = 2.0 / dVar6;
  lattice::lattice(in_stack_fffffffffffffe30,iVar10);
  lattice::fill(in_stack_fffffffffffffe30,iVar10);
  poVar1 = std::operator<<((ostream *)&std::cout,"Generator : ");
  pcVar2 = trng::mrg5::name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"Splitting level : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"T = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar6);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"Lattice = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"Samples = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  std::operator<<(poVar1,'\n');
  for (local_b4 = 0; SBORROW8((long)local_b4,local_10 * 2) != (long)local_b4 + local_10 * -2 < 0;
      local_b4 = local_b4 + 1) {
    wolffstep<trng::mrg5>
              (in_stack_ffffffffffffff20,
               (lattice *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
  }
  timer::timer(in_stack_fffffffffffffe20);
  for (local_cc = 0; local_cc < 10; local_cc = local_cc + 1) {
    local_d8 = 0.0;
    R_00 = (mrg5 *)0x0;
    for (iVar10 = 0; iVar10 < local_10; iVar10 = iVar10 + 1) {
      wolffstep<trng::mrg5>
                (R_00,(lattice *)CONCAT44(iVar10,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff10 = lattice::energy(in_stack_fffffffffffffe40);
      local_d8 = in_stack_ffffffffffffff10 + local_d8;
      R_00 = (mrg5 *)(in_stack_ffffffffffffff10 * in_stack_ffffffffffffff10 + (double)R_00);
    }
    in_stack_fffffffffffffe40 = (lattice *)(local_d8 / (double)local_10);
    dVar7 = (double)local_10;
    lVar3 = local_20 * local_20;
    dVar8 = dVar6 * dVar6;
    dVar9 = -(double)in_stack_fffffffffffffe40 * (double)in_stack_fffffffffffffe40;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(long)local_cc);
    *pvVar4 = (value_type)in_stack_fffffffffffffe40;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff80,
                        (long)local_cc);
    *pvVar4 = ((double)lVar3 / dVar8) * (dVar9 + (double)R_00 / dVar7);
  }
  output(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
         in_stack_ffffffffffffff78,dVar6);
  poVar1 = std::operator<<((ostream *)&std::cout,'\n');
  pcVar2 = "Time: ";
  poVar1 = std::operator<<(poVar1,"Time: ");
  timer::time(&local_c8,(time_t *)pcVar2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar1,extraout_XMM0_Qa);
  poVar5 = std::operator<<(poVar5," sec.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  lattice::~lattice((lattice *)0x1093d2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar1);
  return;
}

Assistant:

void wolff_main(RNG_type &R, long runs, long split, long L) {
  double E_exact, c_exact;
  switch (L) {
    case 8:
      E_exact = -1.4915891074397066;
      c_exact = 1.1455592398944086;
      break;
    case 12:
      E_exact = -1.4659608164862789;
      c_exact = 1.3529506829072697;
      break;
    case 16:
      E_exact = -1.4530648528134771;
      c_exact = 1.4987049594000261;
      break;
    case 20:
      E_exact = -1.4453094678058525;
      c_exact = 1.6111614949041113;
      break;
    case 24:
      E_exact = -1.4401334960573388;
      c_exact = 1.7027336877232671;
      break;
    case 28:
      E_exact = -1.4364340850836483;
      c_exact = 1.7799744882644384;
      break;
    case 32:
      E_exact = -1.4336584661462483;
      c_exact = 1.8467675900395589;
      break;
    case 36:
      E_exact = -1.4314991053179871;
      c_exact = 1.9056050418011437;
      break;
    case 40:
      E_exact = -1.4297713123073425;
      c_exact = 1.9581816502509387;
      break;
    case 44:
      E_exact = -1.4283574829971357;
      c_exact = 2.0057024700476327;
      break;
    case 48:
      E_exact = -1.4271791793855239;
      c_exact = 2.0490550151069595;
      break;
    case 52:
      E_exact = -1.4261820801536625;
      c_exact = 2.0889118621693695;
      break;
    case 56:
      E_exact = -1.4253273745116323;
      c_exact = 2.1257948956620735;
      break;
    case 60:
      E_exact = -1.4245865955789106;
      c_exact = 2.1601172105639529;
      break;
    case 64:
      E_exact = -1.4239383898330109;
      c_exact = 2.1922113931405711;
      break;
    default:
      std::cerr << "invalid lattice size, try 8, 12, ..., 64\n";
      std::exit(EXIT_FAILURE);
  }

  // const double
  const int simulations{10};
  std::vector<double> Ea(simulations + 2);
  std::vector<double> ca(simulations + 2);

  std::cout.setf(std::ios::fixed);
  std::cout.setf(std::ios::showpoint);
  const double T{2.0 / std::log1p(std::sqrt(2.0))};
  lattice s(L);
  s.fill(-1);
  std::cout << "Generator : " << R.name() << '\n'
            << "Splitting level : " << split << '\n'
            << '\n'
            << "T = " << T << '\n'
            << "Lattice = " << L << "x" << L << '\n'
            << "Samples = " << runs << '\n';

  for (int i{0}; i < 2 * runs; ++i)
    wolffstep(R, s, T);
  timer t;
  for (int j{0}; j < simulations; ++j) {
    double E{0.0};
    double E2{0.0};
    for (int i{0}; i < runs; ++i) {
      wolffstep(R, s, T);
      const double q{s.energy()};
      E += q;
      E2 += q * q;
    }
    E /= runs;
    E2 /= runs;
    double c = (L * L) / (T * T) * (E2 - E * E);
    Ea[j] = E;
    ca[j] = c;
  }
  output(Ea, ca, simulations, E_exact, c_exact);
  std::cout << '\n' << "Time: " << t.time() << " sec." << std::endl;
}